

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O2

void __thiscall Snes_Spc::dsp_write(Snes_Spc *this,int data,rel_time_t time)

{
  int *piVar1;
  uint uVar2;
  byte bVar3;
  size_t __n;
  uint uVar4;
  
  bVar3 = (this->m).smp_regs[0][2];
  uVar2 = (this->m).dsp_time;
  __n = (size_t)uVar2;
  uVar4 = time - ((int)this->reg_times[bVar3] + uVar2);
  if ((int)uVar4 < 0) {
    if (uVar2 == 0x7f) {
      if (bVar3 == 0x5c) {
        piVar1 = &(this->m).skipped_koff;
        *piVar1 = *piVar1 | data;
        piVar1 = &(this->m).skipped_kon;
        *piVar1 = *piVar1 & ~data;
        bVar3 = 0x5c;
        goto LAB_00571ca8;
      }
      if (bVar3 == 0x4c) {
        piVar1 = &(this->m).skipped_kon;
        *piVar1 = *piVar1 | ~(uint)(this->dsp).m.regs[0x5c] & data;
        bVar3 = 0x4c;
        goto LAB_00571ca8;
      }
    }
  }
  else {
    uVar4 = uVar4 & 0x7fffffe0;
    (this->m).dsp_time = uVar4 + uVar2 + 0x20;
    Spc_Dsp::run(&this->dsp,uVar4 + 0x20);
    bVar3 = (this->m).smp_regs[0][2];
  }
  if ((char)bVar3 < '\0') {
    return;
  }
LAB_00571ca8:
  Spc_Dsp::write(&this->dsp,(uint)bVar3,(void *)(ulong)(uint)data,__n);
  return;
}

Assistant:

inline void Snes_Spc::dsp_write( int data, rel_time_t time )
{
	RUN_DSP( time, reg_times [REGS [r_dspaddr]] )
	#if SPC_LESS_ACCURATE
		else if ( m.dsp_time == skipping_time )
		{
			int r = REGS [r_dspaddr];
			if ( r == Spc_Dsp::r_kon )
				m.skipped_kon |= data & ~dsp.read( Spc_Dsp::r_koff );
			
			if ( r == Spc_Dsp::r_koff )
			{
				m.skipped_koff |= data;
				m.skipped_kon &= ~data;
			}
		}
	#endif
	
	#ifdef SPC_DSP_WRITE_HOOK
		SPC_DSP_WRITE_HOOK( m.spc_time + time, REGS [r_dspaddr], (uint8_t) data );
	#endif
	
	if ( REGS [r_dspaddr] <= 0x7F )
		dsp.write( REGS [r_dspaddr], data );
	else if ( !SPC_MORE_ACCURACY )
		debug_printf( "SPC wrote to DSP register > $7F\n" );
}